

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs,int frame)

{
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  float fVar4;
  any withinSpec;
  allocator<char> local_51;
  any local_50;
  string local_40;
  
  std::any::any(&local_50,&instruction->value);
  ptVar3 = std::any::type(&local_50);
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&float::typeinfo);
  if (bVar1) {
    fVar4 = std::any_cast<float>(&local_50);
  }
  else {
    ptVar3 = std::any::type(&local_50);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&int::typeinfo);
    if (bVar1) {
      iVar2 = std::any_cast<int>(&local_50);
      fVar4 = (float)iVar2;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"casting error in withinInstruction",&local_51);
      evalError(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      SelectionSet::clearAll(bs);
      fVar4 = 0.0;
    }
  }
  DistanceFinder::find((SelectionSet *)&local_40,&this->distanceFinder,bs,(double)fVar4,frame);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&bs->bitsets_,&local_40);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_40);
  std::any::reset(&local_50);
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs, int frame) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance, frame);
  }